

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O3

Literal __thiscall Satyricon::SATSolver::choice_lit(SATSolver *this)

{
  int iVar1;
  Literal LVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  
  if ((this->param).enable_random_choice == true) {
    iVar1 = this->seed_1 * 0x10dcd;
    uVar8 = iVar1 + 0x3039;
    this->seed_1 = uVar8;
    uVar7 = this->seed_2 << 0xd ^ this->seed_2;
    uVar7 = uVar7 >> 0x11 ^ uVar7;
    uVar7 = uVar7 << 5 ^ uVar7;
    this->seed_2 = uVar7;
    uVar4 = (ulong)this->seed_4 + (ulong)this->seed_3 * 0x29a65ead;
    uVar5 = uVar4 >> 0x20;
    uVar3 = (uint32_t)(uVar4 >> 0x20);
    this->seed_4 = uVar3;
    this->seed_3 = uVar3;
    iVar1 = iVar1 + uVar7 + 0x3039 + uVar3;
    if (((uint)(iVar1 * -0x3d70a3d7) >> 2 | iVar1 * 0x40000000) < 0x28f5c29) {
      do {
        iVar1 = uVar8 * 0x10dcd;
        uVar7 = uVar7 << 0xd ^ uVar7;
        uVar7 = uVar7 >> 0x11 ^ uVar7;
        uVar7 = uVar7 << 5 ^ uVar7;
        uVar4 = uVar5 * 0x29a65eae;
        uVar5 = uVar4 >> 0x20;
        uVar8 = iVar1 + 0x3039;
        uVar6 = (uVar7 + iVar1 + 0x3039 + (int)(uVar4 >> 0x20)) % this->number_of_variable;
      } while ((this->values).
               super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar6] != LIT_UNASIGNED);
      this->seed_1 = uVar8 * 0x10dcd + 0x3039;
      uVar7 = uVar7 << 0xd ^ uVar7;
      uVar7 = uVar7 >> 0x11 ^ uVar7;
      this->seed_2 = uVar7 << 5 ^ uVar7;
      uVar3 = (uint32_t)(uVar5 * 0x29a65eae >> 0x20);
      this->seed_4 = uVar3;
      this->seed_3 = uVar3;
      return (Literal)((uVar8 * 0x10dcd + uVar3 + 0x3039 + uVar7 & 1) + uVar6 * 2);
    }
  }
  do {
    LVar2 = Literal_Heap::pop_max(&(this->order).order);
  } while ((((this->order).assignment)->
           super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>).
           _M_impl.super__Vector_impl_data._M_start[(uint)LVar2.value >> 1] != LIT_UNASIGNED);
  return (Literal)LVar2.value;
}

Assistant:

Literal SATSolver::choice_lit() {

    // random choice 1% of times
    if ( param.enable_random_choice &&  random() % 100 == 0 ) {
        int val;
        do {
            val = random() % number_of_variable;
        } while ( values[val] != LIT_UNASIGNED );
        return Literal ( val,static_cast<bool>(random() % 2) ) ;
    }

    // otherwise select from order
    return order.decision();
}